

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

void buildXDBsortedAtomRecs(xformDatabase *xdb)

{
  int iVar1;
  xformAtomRecords **__base;
  transformData *ptVar2;
  xformAtomRecords *pxVar3;
  int iVar4;
  xformAtomRecords **ppxVar5;
  ulong __nmemb;
  size_t __size;
  
  if (xdb != (xformDatabase *)0x0) {
    ptVar2 = xdb->xforms;
    if (ptVar2 == (transformData *)0x0) {
      __size = 8;
    }
    else {
      iVar4 = 0;
      do {
        pxVar3 = (xformAtomRecords *)&ptVar2->recs;
        iVar1 = iVar4;
        do {
          iVar4 = iVar1;
          pxVar3 = pxVar3->next;
          iVar1 = iVar4 + 1;
        } while (pxVar3 != (xformAtomRecords *)0x0);
        ptVar2 = ptVar2->next;
      } while (ptVar2 != (transformdata_t *)0x0);
      __size = (long)(iVar4 + 1) << 3;
    }
    __base = (xformAtomRecords **)malloc(__size);
    if (__base == (xformAtomRecords **)0x0) {
      errmsg("could not create atom sorted-order array");
      __base = (xformAtomRecords **)0x0;
    }
    else {
      ptVar2 = xdb->xforms;
      __nmemb = 0;
      if (ptVar2 != (transformData *)0x0) {
        do {
          pxVar3 = ptVar2->recs;
          if (pxVar3 != (xformAtomRecords *)0x0) {
            ppxVar5 = __base + (int)__nmemb;
            do {
              *ppxVar5 = pxVar3;
              pxVar3 = pxVar3->next;
              ppxVar5 = ppxVar5 + 1;
              __nmemb = (ulong)((int)__nmemb + 1);
            } while (pxVar3 != (xformAtomRecords_t *)0x0);
          }
          ptVar2 = ptVar2->next;
        } while (ptVar2 != (transformdata_t *)0x0);
        __nmemb = (ulong)(int)__nmemb;
      }
      __base[__nmemb] = (xformAtomRecords *)0x0;
      qsort(__base,__nmemb,8,compareXDBAtomRecs);
    }
    xdb->sortedByRes = __base;
  }
  return;
}

Assistant:

void buildXDBsortedAtomRecs(xformDatabase* xdb) {
   transformData *xform = NULL;
   xformAtomRecords *xa = NULL;
   xformAtomRecords **srtvec = NULL;
   int n = 0;

   if (xdb) {
      n = 0; /* first count the number of atoms */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    n++;
	 }
      }

      /* build an array with extra room for a terminating null pointer */
      srtvec = (xformAtomRecords**)malloc((n + 1)*sizeof(xformAtomRecords*));
      if (!srtvec) {
	 errmsg("could not create atom sorted-order array");
	 xdb->sortedByRes = NULL;
	 return;
      }

      n = 0; /* now we store pointers to the AtomRecs in the array */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    srtvec[n] = xa;
	    n++;
	 }
      }
      srtvec[n] = NULL; /* array ends with a NULL */

      qsort(&(srtvec[0]), n, sizeof(xformAtomRecords*), compareXDBAtomRecs);

      xdb->sortedByRes = srtvec; /* stash away the sorted array */
   }
}